

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffcmap.c
# Opt level: O3

FT_UInt32 cff_cmap_encoding_char_next(CFF_CMapStd cmap,FT_UInt32 *pchar_code)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)*pchar_code;
  *pchar_code = 0;
  uVar4 = uVar3;
  if (uVar3 < 0xff) {
    while (uVar4 = uVar4 + 1, uVar4 != 0x100) {
      uVar1 = cmap->gids[uVar4];
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      if (uVar1 != 0) {
        *pchar_code = uVar2;
        return (FT_UInt32)uVar1;
      }
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  cff_cmap_encoding_char_next( CFF_CMapStd   cmap,
                               FT_UInt32    *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code;


    *pchar_code = 0;

    if ( char_code < 255 )
    {
      FT_UInt  code = (FT_UInt)(char_code + 1);


      for (;;)
      {
        if ( code >= 256 )
          break;

        result = cmap->gids[code];
        if ( result != 0 )
        {
          *pchar_code = code;
          break;
        }

        code++;
      }
    }
    return result;
  }